

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::ActivityObserver::register_led
          (ActivityObserver *this,string *name,uint8_t param_2)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock_guard;
  uint8_t param_2_local;
  string *name_local;
  ActivityObserver *this_local;
  
  lock_guard._M_device._7_1_ = param_2;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->leds_,name);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void register_led(const std::string &name, uint8_t) final {
			std::lock_guard lock_guard(mutex);
			leds_.push_back(name);
		}